

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Clara::Detail::
BoundBinaryFunction<Catch::ConfigData,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::setFlag(BoundBinaryFunction<Catch::ConfigData,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *this,ConfigData *obj)

{
  type value;
  
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  convertInto<std::__cxx11::string>(true,&value);
  (*this->function)(obj,&value);
  std::__cxx11::string::~string((string *)&value);
  return;
}

Assistant:

virtual void setFlag( C& obj ) const {
                typename RemoveConstRef<T>::type value;
                convertInto( true, value );
                function( obj, value );
            }